

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O2

void __thiscall ctemplate::TemplateDictionary::SetProxy::operator=(SetProxy *this,str_ref value)

{
  TemplateString TVar1;
  char *pcVar2;
  undefined7 uStack_37;
  
  pcVar2 = value.begin_;
  TVar1._17_7_ = uStack_37;
  TVar1.is_immutable_ = pcVar2 < &data_start && "" < pcVar2;
  TVar1.length_ = (long)value.end_ - (long)pcVar2;
  TVar1.ptr_ = pcVar2;
  TVar1.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(*this->variable_,TVar1);
  return;
}

Assistant:

void operator=(str_ref value) {
      dict_.SetValue(variable_, TemplateString(value.data(), value.size()));
    }